

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionStateTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionStateTests::TestClearSessionLog_StateLogNotNull_LogCleared::
~TestClearSessionLog_StateLogNotNull_LogCleared
          (TestClearSessionLog_StateLogNotNull_LogCleared *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(ClearSessionLog_StateLogNotNull_LogCleared)
  {
    SessionSettings settings;
    TestLog log;
    log.events = 5;

    SessionState state;
    state.log(&log);

    state.clear();

    CHECK_EQUAL(0, log.events);
  }